

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MulticastSocket.cpp
# Opt level: O0

bool __thiscall asl::MulticastSocket_::leave(MulticastSocket_ *this,InetAddress *a,int interfac)

{
  byte *pbVar1;
  ip_mreq local_40;
  ip_mreq mr_1;
  ipv6_mreq mr;
  int interfac_local;
  InetAddress *a_local;
  MulticastSocket_ *this_local;
  
  if (*(int *)(this + 0x18) == 2) {
    pbVar1 = InetAddress::ptr(a);
    mr_1 = *(ip_mreq *)(pbVar1 + 8);
    this_local._7_1_ = Socket_::setOption<ipv6_mreq>((Socket_ *)this,0x29,0x15,(ipv6_mreq *)&mr_1);
  }
  else {
    pbVar1 = InetAddress::ptr(a);
    local_40.imr_multiaddr.s_addr = *(in_addr_t *)(pbVar1 + 4);
    local_40.imr_interface.s_addr = interfac;
    this_local._7_1_ = Socket_::setOption<ip_mreq>((Socket_ *)this,0,0x24,&local_40);
  }
  return this_local._7_1_;
}

Assistant:

bool MulticastSocket_::leave(const InetAddress& a, int interfac)
{
	if (_family == InetAddress::IPv6)
	{
		ipv6_mreq mr;
		mr.ipv6mr_multiaddr = ((sockaddr_in6*)a.ptr())->sin6_addr;
		mr.ipv6mr_interface = interfac;
		return setOption(IPPROTO_IPV6, IPV6_DROP_MEMBERSHIP, mr);
	}
	else
	{
		ip_mreq mr;
	mr.imr_multiaddr = ((sockaddr_in*)a.ptr())->sin_addr;
		mr.imr_interface.s_addr = interfac;
	return setOption(IPPROTO_IP, IP_DROP_MEMBERSHIP, mr); // seems to fail on WSL !!
}
}